

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coulombic_energy_compute.cpp
# Opt level: O3

void __thiscall
CoulombicEnergyCompute::particle_cluster_interact
          (CoulombicEnergyCompute *this,array<unsigned_long,_2UL> target_node_idxs,
          size_t source_node_idx)

{
  uint uVar1;
  int iVar2;
  Molecule *pMVar3;
  double *pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  InterpolationPoints *pIVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  pointer pdVar19;
  int k2;
  ulong uVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  uVar15 = target_node_idxs._M_elems[0];
  if (uVar15 < target_node_idxs._M_elems[1]) {
    pMVar3 = this->molecule_;
    pdVar4 = (this->coul_eng_vec_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (pMVar3->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (pMVar3->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (pMVar3->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar8 = (pMVar3->charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = this->num_mol_interp_pts_per_node_;
    uVar14 = (ulong)uVar1;
    pIVar9 = this->mol_interp_pts_;
    iVar2 = this->num_mol_interp_charges_per_node_;
    lVar21 = (long)(int)uVar1 * source_node_idx;
    pdVar10 = (pIVar9->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (pIVar9->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (pIVar9->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13 = (this->mol_interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      if ((int)uVar1 < 1) {
        dVar22 = 0.0;
      }
      else {
        dVar22 = 0.0;
        iVar17 = 0;
        uVar18 = 0;
        do {
          pdVar19 = pdVar13 + (long)iVar2 * source_node_idx + (long)iVar17;
          dVar23 = pdVar5[uVar15] - pdVar10[lVar21 + uVar18];
          uVar20 = 0;
          do {
            dVar24 = pdVar6[uVar15] - pdVar11[lVar21 + uVar20];
            uVar16 = 0;
            do {
              dVar25 = pdVar7[uVar15] - pdVar12[lVar21 + uVar16];
              dVar22 = dVar22 + (pdVar19[uVar16] / this->eps_solute_) /
                                SQRT(dVar25 * dVar25 + dVar24 * dVar24 + dVar23 * dVar23);
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
            uVar20 = uVar20 + 1;
            pdVar19 = pdVar19 + uVar14;
          } while (uVar20 != uVar14);
          uVar18 = uVar18 + 1;
          iVar17 = iVar17 + uVar1 * uVar1;
        } while (uVar18 != uVar14);
      }
      *pdVar4 = dVar22 * pdVar8[uVar15] + *pdVar4;
      uVar15 = uVar15 + 1;
    } while (uVar15 != target_node_idxs._M_elems[1]);
  }
  return;
}

Assistant:

void CoulombicEnergyCompute::particle_cluster_interact(std::array<std::size_t, 2> target_node_idxs,
                                                       std::size_t source_node_idx)
{
//    timers_.particle_cluster_interact.start();
    
    /* Targets */
    
    std::size_t target_node_begin          = target_node_idxs[0];
    std::size_t target_node_end            = target_node_idxs[1];
    
    const double* __restrict mol_x_ptr = molecule_.x_ptr();
    const double* __restrict mol_y_ptr = molecule_.y_ptr();
    const double* __restrict mol_z_ptr = molecule_.z_ptr();

    const double* __restrict mol_q_ptr = molecule_.charge_ptr();

    /* Sources */
    
    int num_mol_interp_pts_per_node                 = num_mol_interp_pts_per_node_;
    int num_mol_interp_charges_per_node             = num_mol_interp_charges_per_node_;

    std::size_t source_cluster_interp_pts_begin     = source_node_idx * num_mol_interp_pts_per_node_;
    std::size_t source_cluster_interp_charges_begin = source_node_idx * num_mol_interp_charges_per_node_;
    
    const double* __restrict mol_clusters_x_ptr     = mol_interp_pts_.interp_x_ptr();
    const double* __restrict mol_clusters_y_ptr     = mol_interp_pts_.interp_y_ptr();
    const double* __restrict mol_clusters_z_ptr     = mol_interp_pts_.interp_z_ptr();
    
    const double* __restrict mol_clusters_q_ptr     = mol_interp_charge_.data();

    /* Potential */

    double* __restrict coul_eng_ptr = coul_eng_vec_.data();
    
    
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop async(stream_id) present(mol_x_ptr, mol_y_ptr, mol_z_ptr, mol_q_ptr, \
                                      mol_clusters_x_ptr, mol_clusters_y_ptr, mol_clusters_z_ptr, \
                                      mol_clusters_q_ptr, coul_eng_ptr)
#endif
    for (std::size_t j = target_node_begin; j < target_node_end; ++j) {

        double target_x = mol_x_ptr[j];
        double target_y = mol_y_ptr[j];
        double target_z = mol_z_ptr[j];
        double target_q = mol_q_ptr[j];
        
        double pot_temp = 0.;
        
#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) reduction(+:pot_temp)
#endif
        for (int k1 = 0; k1 < num_mol_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_mol_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_mol_interp_pts_per_node; ++k3) {
                
            std::size_t kk = source_cluster_interp_charges_begin
                           + k1 * num_mol_interp_pts_per_node * num_mol_interp_pts_per_node
                           + k2 * num_mol_interp_pts_per_node + k3;

            double dx = target_x - mol_clusters_x_ptr[source_cluster_interp_pts_begin + k1];
            double dy = target_y - mol_clusters_y_ptr[source_cluster_interp_pts_begin + k2];
            double dz = target_z - mol_clusters_z_ptr[source_cluster_interp_pts_begin + k3];

            pot_temp += mol_clusters_q_ptr[kk] / eps_solute_ / std::sqrt(dx*dx + dy*dy + dz*dz);
        }
        }
        }
        
        pot_temp *= target_q;

#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif  OPENMP_ENABLED
        #pragma omp atomic update
#endif
        coul_eng_ptr[0] += pot_temp;
    }

//    timers_.particle_cluster_interact.stop();
}